

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O3

void __thiscall
cmExportFileGenerator::SetImportLinkProperty<cmLinkItem>
          (cmExportFileGenerator *this,string *suffix,cmGeneratorTarget *target,string *propName,
          vector<cmLinkItem,_std::allocator<cmLinkItem>_> *entries,ImportPropertyMap *properties,
          ImportLinkPropertyTargetNames targetNames)

{
  cmLinkItem *pcVar1;
  pointer pcVar2;
  string *psVar3;
  mapped_type *pmVar4;
  cmLinkItem *this_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string temp;
  string prop;
  undefined1 *local_d0;
  undefined8 local_c8;
  undefined1 local_c0;
  undefined7 uStack_bf;
  ImportPropertyMap *local_b0;
  string *local_a8;
  string *local_a0;
  cmGeneratorTarget *local_98;
  cmLocalGenerator *local_90;
  cmExportFileGenerator *local_88;
  string local_80;
  pointer local_60;
  undefined8 local_58;
  string local_50;
  
  if ((entries->super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>)._M_impl.
      super__Vector_impl_data._M_start !=
      (entries->super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    local_b0 = properties;
    local_a8 = suffix;
    local_a0 = propName;
    local_98 = target;
    local_88 = this;
    local_90 = cmGeneratorTarget::GetLocalGenerator(target);
    local_d0 = &local_c0;
    local_c8 = 0;
    local_c0 = 0;
    this_00 = (entries->super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pcVar1 = (entries->super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (this_00 != pcVar1) {
      do {
        std::__cxx11::string::append((char *)&local_d0);
        if (targetNames == Yes) {
          psVar3 = cmLinkItem::AsStr_abi_cxx11_(this_00);
          local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
          pcVar2 = (psVar3->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_80,pcVar2,pcVar2 + psVar3->_M_string_length);
          AddTargetNamespace(local_88,&local_80,local_98,local_90);
          std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_80._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          psVar3 = cmLinkItem::AsStr_abi_cxx11_(this_00);
          std::__cxx11::string::_M_append((char *)&local_d0,(ulong)(psVar3->_M_dataplus)._M_p);
        }
        this_00 = this_00 + 1;
      } while (this_00 != pcVar1);
    }
    local_80._M_string_length = (size_type)(local_a0->_M_dataplus)._M_p;
    local_80._M_dataplus._M_p = (pointer)local_a0->_M_string_length;
    local_80.field_2._M_allocated_capacity = 0;
    local_60 = (local_a8->_M_dataplus)._M_p;
    local_80.field_2._8_8_ = local_a8->_M_string_length;
    local_58 = 0;
    views._M_len = 2;
    views._M_array = (iterator)&local_80;
    cmCatViews(&local_50,views);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_b0,&local_50);
    std::__cxx11::string::_M_assign((string *)pmVar4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,CONCAT71(uStack_bf,local_c0) + 1);
    }
  }
  return;
}

Assistant:

void cmExportFileGenerator::SetImportLinkProperty(
  std::string const& suffix, cmGeneratorTarget const* target,
  const std::string& propName, std::vector<T> const& entries,
  ImportPropertyMap& properties, ImportLinkPropertyTargetNames targetNames)
{
  // Skip the property if there are no entries.
  if (entries.empty()) {
    return;
  }

  cmLocalGenerator const* lg = target->GetLocalGenerator();

  // Construct the property value.
  std::string link_entries;
  const char* sep = "";
  for (T const& l : entries) {
    // Separate this from the previous entry.
    link_entries += sep;
    sep = ";";

    if (targetNames == ImportLinkPropertyTargetNames::Yes) {
      std::string temp = asString(l);
      this->AddTargetNamespace(temp, target, lg);
      link_entries += temp;
    } else {
      link_entries += asString(l);
    }
  }

  // Store the property.
  std::string prop = cmStrCat(propName, suffix);
  properties[prop] = link_entries;
}